

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmtimer.cpp
# Opt level: O0

bool __thiscall FM::Timer::Count(Timer *this,int32 us)

{
  bool local_15;
  bool event;
  int32 us_local;
  Timer *this_local;
  
  local_15 = false;
  if ((this->timera_count != 0) &&
     (this->timera_count = this->timera_count + us * -0x10000, this->timera_count < 1)) {
    local_15 = true;
    (*this->_vptr_Timer[2])();
    while (this->timera_count < 1) {
      this->timera_count = this->timera + this->timera_count;
    }
    if ((this->regtc & 4) != 0) {
      (**this->_vptr_Timer)(this,1);
    }
  }
  if ((this->timerb_count != 0) &&
     (this->timerb_count = this->timerb_count + us * -0x1000, this->timerb_count < 1)) {
    local_15 = true;
    while (this->timerb_count < 1) {
      this->timerb_count = this->timerb + this->timerb_count;
    }
    if ((this->regtc & 8) != 0) {
      (**this->_vptr_Timer)(this,2);
    }
  }
  return local_15;
}

Assistant:

bool Timer::Count(int32 us)
{
	bool event = false;

	if (timera_count)
	{
		timera_count -= us << 16;
		if (timera_count <= 0)
		{
			event = true;
			TimerA();

			while (timera_count <= 0)
				timera_count += timera;
			
			if (regtc & 4)
				SetStatus(1);
		}
	}
	if (timerb_count)
	{
		timerb_count -= us << 12;
		if (timerb_count <= 0)
		{
			event = true;
			while (timerb_count <= 0)
				timerb_count += timerb;
			
			if (regtc & 8)
				SetStatus(2);
		}
	}
	return event;
}